

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O0

int ec_bits(EVP_PKEY *pkey)

{
  EC_GROUP *group_00;
  EC_GROUP *group;
  EC_KEY *ec_key;
  EVP_PKEY *pkey_local;
  
  group_00 = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)pkey->pkey);
  if (group_00 == (EC_GROUP *)0x0) {
    ERR_clear_error();
    pkey_local._4_4_ = 0;
  }
  else {
    pkey_local._4_4_ = EC_GROUP_order_bits(group_00);
  }
  return pkey_local._4_4_;
}

Assistant:

static int ec_bits(const EVP_PKEY *pkey) {
  const EC_KEY *ec_key = reinterpret_cast<const EC_KEY *>(pkey->pkey);
  const EC_GROUP *group = EC_KEY_get0_group(ec_key);
  if (group == NULL) {
    ERR_clear_error();
    return 0;
  }
  return EC_GROUP_order_bits(group);
}